

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
::_call<0>(cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *__args;
  
  __args = try_convert_and_check<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  std::function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>::
  operator()(&this->mFunc,__args);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}